

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O0

int64_t __thiscall
hta::storage::file::Metric::find_index_on_or_after_binary
          (Metric *this,TimePoint t,int64_t left,int64_t right,int64_t sz)

{
  bool bVar1;
  bool local_71;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_58;
  TimePoint t_pivot;
  int64_t pivot;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_40;
  int64_t local_38;
  int64_t sz_local;
  int64_t right_local;
  int64_t left_local;
  Metric *this_local;
  TimePoint t_local;
  
  local_38 = sz;
  sz_local = right;
  right_local = left;
  left_local = (int64_t)this;
  this_local = (Metric *)
               t.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r;
  if (right <= left) {
    __assert_fail("left < right",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                  ,0xa4,
                  "int64_t hta::storage::file::Metric::find_index_on_or_after_binary(TimePoint, int64_t, int64_t, int64_t)"
                 );
  }
  local_40.__d.__r = (duration)get_raw_ts(this,left);
  bVar1 = std::chrono::operator<
                    (&local_40,
                     (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)&this_local);
  if (!bVar1) {
    __assert_fail("get_raw_ts(left) < t",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                  ,0xa6,
                  "int64_t hta::storage::file::Metric::find_index_on_or_after_binary(TimePoint, int64_t, int64_t, int64_t)"
                 );
  }
  local_71 = true;
  if (sz_local != local_38) {
    pivot = (int64_t)get_raw_ts(this,sz_local);
    local_71 = std::chrono::operator<=
                         ((time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           *)&this_local,
                          (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           *)&pivot);
  }
  if (local_71 == false) {
    __assert_fail("right == sz || t <= get_raw_ts(right)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                  ,0xa7,
                  "int64_t hta::storage::file::Metric::find_index_on_or_after_binary(TimePoint, int64_t, int64_t, int64_t)"
                 );
  }
  if (sz_local - right_local == 1) {
    t_local.super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    .__d.__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
               (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
               sz_local;
  }
  else {
    t_pivot.super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    .__d.__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
               ((right_local + sz_local) / 2);
    if (local_38 <=
        (long)t_pivot.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r) {
      __assert_fail("pivot < sz",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                    ,0xae,
                    "int64_t hta::storage::file::Metric::find_index_on_or_after_binary(TimePoint, int64_t, int64_t, int64_t)"
                   );
    }
    local_58.__d.__r =
         (duration)
         get_raw_ts(this,(uint64_t)
                         t_pivot.
                         super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         .__d.__r);
    bVar1 = std::chrono::operator>
                      ((time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&this_local,&local_58);
    if (bVar1) {
      t_local.
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
            find_index_on_or_after_binary
                      (this,(TimePoint)this_local,
                       (int64_t)t_pivot.
                                super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                .__d.__r,sz_local,local_38);
    }
    else {
      t_local.
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
            find_index_on_or_after_binary
                      (this,(TimePoint)this_local,right_local,
                       (int64_t)t_pivot.
                                super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                .__d.__r,local_38);
    }
  }
  return (duration)
         t_local.
         super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
         __d.__r;
}

Assistant:

int64_t Metric::find_index_on_or_after_binary(TimePoint t, int64_t left, int64_t right, int64_t sz)
{
    // left < right means right != 0
    // assumes monotonicity ts(left) < ts(right)
    // invariant ts(left) < t <= ts(right)
    // right can be size() // out of range, but the pivot can never be
    assert(left < right);
    // TODO expensive, use extra debug macro
    assert(get_raw_ts(left) < t);
    assert(right == sz || t <= get_raw_ts(right));

    if (right - left == 1)
    {
        return right;
    }
    auto pivot = (left + right) / 2;
    assert(pivot < sz);

    TimePoint t_pivot = get_raw_ts(pivot);
    if (t > t_pivot)
    {
        return find_index_on_or_after_binary(t, pivot, right, sz);
    }
    else
    {
        return find_index_on_or_after_binary(t, left, pivot, sz);
    }
}